

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O3

bool_t bf_put_int8(bfile_t *bfile,int8_t value)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = bfile->pos;
  uVar2 = (ulong)bfile->buffer_size;
  if (uVar2 <= uVar1 - bfile->ipos) {
    bf_write_buffer(bfile);
    uVar1 = bfile->pos;
    uVar2 = (ulong)bfile->buffer_size;
  }
  bfile->buffer[(int)(uVar1 % uVar2)] = value;
  bfile->pos = bfile->pos + 1;
  return 1;
}

Assistant:

bool_t
bf_put_int8(
    bfile_t * bfile,
    int8_t value )
{
    int8_t * buffer;
    int bufpos;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_WRITABLE) != FALSE );

    if ( (bfile->pos - bfile->ipos) >= bfile->buffer_size ) 
        bf_write_buffer( bfile );

    buffer = (int8_t *) bfile->buffer;
    bufpos = bfile->pos % bfile->buffer_size;
    buffer[bufpos] = (value & 0xff);
    bfile->pos++;
    return TRUE;
}